

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O2

bool __thiscall asl::TabularDataFile::nextRow(TabularDataFile *this)

{
  String *pSVar1;
  Array<asl::Var> *this_00;
  char cVar2;
  bool bVar3;
  int iVar4;
  uint y;
  char cVar5;
  int iVar6;
  anon_union_16_2_78e7fdac_for_String_2 *paVar7;
  ulong uVar8;
  uint uVar9;
  double dVar10;
  Var local_80;
  Array<asl::String> *local_70;
  anon_union_16_2_78e7fdac_for_String_2 *local_68;
  TabularDataFile *local_60;
  String value;
  
  if ((((this->_file).super_File._file != (FILE *)0x0) || (bVar3 = readHeader(this), bVar3)) &&
     (bVar3 = TextFile::end(&this->_file), !bVar3)) {
    pSVar1 = &this->_currentLine;
    bVar3 = TextFile::readLine(&this->_file,pSVar1);
    if (bVar3) {
      if (((this->_dataStarted == false) && (2 < (this->_currentLine)._len)) &&
         (bVar3 = String::startsWith(pSVar1,anon_var_dwarf_8a66f), bVar3)) {
        String::substr(&value,pSVar1,3);
        String::operator=(pSVar1,&value);
        String::~String(&value);
      }
      local_70 = &this->_currentRowParts;
      Array<asl::String>::clear(local_70);
      if ((this->_currentLine)._size == 0) {
        paVar7 = &(this->_currentLine).field_2;
      }
      else {
        paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_currentLine).field_2._str;
      }
      value.field_2._space[0] = '\0';
      value._size = 0;
      value._len = 0;
      iVar4 = 0;
LAB_0013cb80:
      do {
        cVar2 = paVar7->_space[0];
        if (cVar2 == '\0') {
          Array<asl::String>::operator<<(local_70,&value);
          this_00 = &this->_row;
          Array<asl::Var>::clear(this_00);
          cVar2 = this->_decimal;
          iVar4 = (this->_types)._len;
          uVar8 = (ulong)*(uint *)&(this->_currentRowParts)._a[-1].field_2 << 0x20;
          uVar9 = 1;
          local_60 = this;
          do {
            if ((uVar9 == 0) || (iVar6 = (int)uVar8, (int)(uVar8 >> 0x20) <= iVar6)) {
              local_60->_dataStarted = true;
              String::~String(&value);
              return true;
            }
            pSVar1 = local_70->_a + iVar6;
            local_68 = &local_70->_a[iVar6].field_2;
            while (0 < (int)uVar9) {
              while (bVar3 = uVar9 != 0, uVar9 = uVar9 - 1, bVar3) {
                if (iVar4 <= iVar6) {
                  bVar3 = myisnumber(pSVar1,cVar2);
                  if (bVar3) {
                    if (cVar2 != '.') {
                      String::replaceme(pSVar1,cVar2,'.');
                    }
                    paVar7 = local_68;
                    if (pSVar1->_size != 0) {
                      paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar1->field_2)._str;
                    }
                    dVar10 = myatof(paVar7->_space);
                    Var::Var(&local_80,dVar10);
                    Array<asl::Var>::operator<<(this_00,&local_80);
                  }
                  else {
                    Var::Var(&local_80,pSVar1);
                    Array<asl::Var>::operator<<(this_00,&local_80);
                  }
                  goto LAB_0013cdfe;
                }
                paVar7 = &(this->_types).field_2;
                if ((local_60->_types)._size != 0) {
                  paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(local_60->_types).field_2._str;
                }
                cVar5 = paVar7->_space[iVar6];
                if (cVar5 == 'h') {
                  y = String::hexToInt(pSVar1);
                  Var::Var(&local_80,y);
                  Array<asl::Var>::operator<<(this_00,&local_80);
                  goto LAB_0013cdfe;
                }
                if (cVar5 == 'i') {
                  paVar7 = local_68;
                  if (pSVar1->_size != 0) {
                    paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar1->field_2)._str;
                  }
                  local_80.field_1._i = myatoi(paVar7->_space);
                  local_80._type = INT;
                  Array<asl::Var>::operator<<(this_00,&local_80);
                  goto LAB_0013cdfe;
                }
                if (cVar5 == 's') {
                  Var::Var(&local_80,pSVar1);
                  Array<asl::Var>::operator<<(this_00,&local_80);
                  goto LAB_0013cdfe;
                }
                if (cVar5 == 'n') {
                  if (cVar2 != '.') {
                    String::replaceme(pSVar1,cVar2,'.');
                  }
                  paVar7 = local_68;
                  if (pSVar1->_size != 0) {
                    paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar1->field_2)._str;
                  }
                  dVar10 = myatof(paVar7->_space);
                  Var::Var(&local_80,dVar10);
                  Array<asl::Var>::operator<<(this_00,&local_80);
LAB_0013cdfe:
                  Var::~Var(&local_80);
                }
              }
              uVar9 = 0xfffffffe;
            }
            uVar8 = uVar8 & 0xffffffff00000000 | (ulong)(iVar6 + 1);
            uVar9 = ~uVar9;
          } while( true );
        }
        paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)((long)paVar7 + 1);
        iVar6 = 1;
        if (iVar4 != 2) {
          if (iVar4 == 1) {
            cVar5 = cVar2;
            iVar4 = 2;
            if (cVar2 != '\"') {
LAB_0013cba6:
              String::operator+=(&value,cVar5);
              iVar4 = iVar6;
            }
          }
          else {
            iVar4 = iVar6;
            if (cVar2 != '\"') {
              if (cVar2 == this->_separator) goto LAB_0013cbdf;
              String::operator+=(&value,cVar2);
              iVar4 = 0;
            }
          }
          goto LAB_0013cb80;
        }
        cVar5 = '\"';
        if (cVar2 == '\"') goto LAB_0013cba6;
        iVar4 = iVar6;
        if (cVar2 == this->_separator) {
LAB_0013cbdf:
          Array<asl::String>::operator<<(local_70,&value);
          String::operator=(&value,"");
          iVar4 = 0;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool TabularDataFile::nextRow()
{
	String& line = _currentLine;
	if(!_file)
	{
		if (!readHeader())
			return false;
	}
	if (_file.end() || !_file.readLine(line))
		return false;
	
	if (!_dataStarted && line.length() >= 3 && line.startsWith("\xef\xbb\xbf")) // eat BOM
		line = line.substr(3);
	
	Array<String>& row = _currentRowParts;

	row.clear();
	const char* p = line.data();
	char        c = ' ';
	State       state = BASE;
	String      value;
	while ((c = *p++))
	{
		switch (state)
		{
		case BASE:
			if (c == '"')
				state = QUOTE;
			else if (c == _separator)
			{
				row << value;
				value = "";
			}
			else
				value << c;
			break;
		case QUOTE:
			if (c != '"')
			{
				value << c;
			}
			else
				state = QUOTE2;
			break;
		case QUOTE2:
			if (c == '"')
			{
				value << c;
				state = QUOTE;
			}
			else if (c == _separator)
			{
				row << value;
				value = "";
				state = BASE;
			}
			else
				state = QUOTE;
			break;
		default:
			value << c;
		}
	}

	row << value;

	_row.clear();
	char decimal = _decimal;
	int ntypes = _types.length();
	
	foreach2(int i, String& v, row)
	{
		if(ntypes > i)
		{
			switch(_types[i])
			{
			case 'n':
				if (decimal != '.')
					v.replaceme(decimal, '.');
				_row << myatof(*v);
				break;
			case 's':
				_row << v;
				break;
			case 'i':
				_row << myatoi(*v);
				break;
			case 'h':
				_row << v.hexToInt();
				break;
			}
		}
		else
		{
			if (myisnumber(v, decimal))
			{
				if (decimal != '.')
					v.replaceme(decimal, '.');
					_row << myatof(*v);
			}
			else
				_row << v;
		}
	}
	_dataStarted = true;
	return true;
}